

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::Relation::Execute(Relation *this)

{
  ClientContext *relation;
  long in_RSI;
  enable_shared_from_this<duckdb::Relation> eStack_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)(in_RSI + 0x18));
  ClientContextWrapper::GetContext((ClientContextWrapper *)&stack0xffffffffffffffd8);
  relation = shared_ptr<duckdb::ClientContext,_true>::operator->
                       ((shared_ptr<duckdb::ClientContext,_true> *)&stack0xffffffffffffffd8);
  enable_shared_from_this<duckdb::Relation>::shared_from_this(&eStack_38);
  ClientContext::Execute((ClientContext *)this,(shared_ptr<duckdb::Relation,_true> *)relation);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &eStack_38.__weak_this_.internal.
              super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
}

Assistant:

unique_ptr<QueryResult> Relation::Execute() {
	return context->GetContext()->Execute(shared_from_this());
}